

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

bool __thiscall
rsg::anon_unknown_0::IsSamplerEntry::operator()(IsSamplerEntry *this,ValueEntry *entry)

{
  bool bVar1;
  VariableType local_58;
  
  local_58.m_typeName._M_dataplus._M_p = (pointer)&local_58.m_typeName.field_2;
  local_58.m_baseType = (Type)this;
  local_58.m_precision = PRECISION_NONE;
  local_58.m_typeName._M_string_length = 0;
  local_58.m_typeName.field_2._M_local_buf[0] = '\0';
  local_58.m_numElements = 1;
  local_58.m_elementType = (VariableType *)0x0;
  local_58.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = VariableType::operator==((VariableType *)entry,&local_58);
  VariableType::~VariableType(&local_58);
  return bVar1;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		if (entry->getVariable()->getType() == VariableType(m_type, 1))
		{
			DE_ASSERT(entry->getVariable()->getStorage() == Variable::STORAGE_UNIFORM);
			return true;
		}
		else
			return false;
	}